

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkComputeSupportsSmart(Abc_Ntk_t *pNtk)

{
  undefined4 uVar1;
  int *piVar2;
  void **ppvVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  Abc_Obj_t *pAVar7;
  Supp_Man_t *p;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Abc_Obj_t *pAVar8;
  Vec_Int_t *p_02;
  uint i;
  Vec_Int_t *p1;
  Vec_Int_t *p_03;
  uint uVar9;
  
  for (pAVar8 = (Abc_Obj_t *)0x0; (long)pAVar8 < (long)pNtk->vCis->nSize;
      pAVar8 = (Abc_Obj_t *)((long)&pAVar8->pNtk + 1)) {
    pAVar7 = Abc_NtkCi(pNtk,(int)pAVar8);
    pAVar7->pNext = pAVar8;
  }
  for (pAVar8 = (Abc_Obj_t *)0x0; (long)pAVar8 < (long)pNtk->vCos->nSize;
      pAVar8 = (Abc_Obj_t *)((long)&pAVar8->pNtk + 1)) {
    pAVar7 = Abc_NtkCo(pNtk,(int)pAVar8);
    pAVar7->pNext = pAVar8;
  }
  p_02 = (Vec_Int_t *)&DAT_00000040;
  p = Supp_ManStart(0x100000,0x40);
  p_00 = Vec_PtrAlloc(pNtk->vCos->nSize);
  Abc_NtkCleanCopy(pNtk);
  p_01 = Abc_NtkDfsNatural(pNtk);
  uVar9 = p_01->nSize;
  i = 0;
  if ((int)uVar9 < 1) {
    uVar9 = 0;
    i = 0;
  }
  do {
    iVar6 = (int)p_02;
    if (uVar9 == i) {
      Vec_PtrFree(p_01);
      Supp_ManStop(p);
      Vec_VecSort((Vec_Vec_t *)p_00,iVar6);
      for (iVar6 = 0; iVar6 < pNtk->vCis->nSize; iVar6 = iVar6 + 1) {
        pAVar8 = Abc_NtkCi(pNtk,iVar6);
        pAVar8->pNext = (Abc_Obj_t *)0x0;
      }
      for (iVar6 = 0; iVar6 < pNtk->vCos->nSize; iVar6 = iVar6 + 1) {
        pAVar8 = Abc_NtkCo(pNtk,iVar6);
        pAVar8->pNext = (Abc_Obj_t *)0x0;
      }
      return p_00;
    }
    p_02 = (Vec_Int_t *)(ulong)i;
    pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(p_01,i);
    uVar5 = *(uint *)&pAVar8->field_0x14 & 0xf;
    if (uVar5 == 7) {
      piVar2 = (pAVar8->vFanins).pArray;
      ppvVar3 = pAVar8->pNtk->vObjs->pArray;
      p1 = *(Vec_Int_t **)((long)ppvVar3[*piVar2] + 0x40);
      p_03 = *(Vec_Int_t **)((long)ppvVar3[piVar2[1]] + 0x40);
      p_02 = p1;
      pAVar7 = (Abc_Obj_t *)
               Supp_ManMergeEntry(p,(Supp_One_t *)p1,(Supp_One_t *)p_03,(pAVar8->vFanouts).nSize);
      (pAVar8->field_6).pCopy = pAVar7;
      if (p1->nCap < 1) {
        __assert_fail("pPart0->nRefs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                      ,0x15a,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
      }
      iVar6 = p1->nCap + -1;
      p1->nCap = iVar6;
      if (iVar6 == 0) {
        Supp_ManRecycleEntry(p,(Supp_One_t *)p1);
        p_02 = p1;
      }
      iVar6 = p_03->nCap;
      if (iVar6 < 1) {
        __assert_fail("pPart1->nRefs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                      ,0x15d,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
      }
LAB_00256e00:
      p_03->nCap = iVar6 + -1;
      if (iVar6 + -1 == 0) {
        Supp_ManRecycleEntry(p,(Supp_One_t *)p_03);
        p_02 = p_03;
      }
    }
    else {
      if (0xfffffffd < uVar5 - 5) {
        pvVar4 = pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray];
        p_03 = *(Vec_Int_t **)((long)pvVar4 + 0x40);
        if ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 7) {
          p_02 = Supp_ManTransferEntry((Supp_One_t *)p_03);
          Vec_IntPush(p_02,*(int *)&pAVar8->pNext);
          Vec_PtrPush(p_00,p_02);
        }
        iVar6 = p_03->nCap;
        if (iVar6 < 1) {
          __assert_fail("pPart0->nRefs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                        ,0x16c,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
        }
        goto LAB_00256e00;
      }
      if ((uVar5 == 5) || (uVar5 == 2)) {
        iVar6 = (pAVar8->vFanouts).nSize;
        if (iVar6 != 0) {
          pAVar7 = (Abc_Obj_t *)Supp_ManFetchEntry(p,1,iVar6);
          uVar1 = *(undefined4 *)&pAVar8->pNext;
          iVar6 = *(int *)((long)&pAVar7->pNtk + 4);
          uVar5 = iVar6 + 1;
          p_02 = (Vec_Int_t *)(ulong)uVar5;
          *(uint *)((long)&pAVar7->pNtk + 4) = uVar5;
          *(undefined4 *)((long)&pAVar7->pNext + (long)iVar6 * 4 + 4) = uVar1;
LAB_00256e39:
          (pAVar8->field_6).pCopy = pAVar7;
        }
      }
      else {
        pAVar7 = Abc_AigConst1(pNtk);
        if (pAVar8 != pAVar7) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                        ,0x181,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
        }
        iVar6 = (pAVar8->vFanouts).nSize;
        if (iVar6 != 0) {
          p_02 = (Vec_Int_t *)0x0;
          pAVar7 = (Abc_Obj_t *)Supp_ManFetchEntry(p,0,iVar6);
          goto LAB_00256e39;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Abc_NtkComputeSupportsSmart( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupports;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vSupp;
    Supp_Man_t * p;
    Supp_One_t * pPart0, * pPart1;
    Abc_Obj_t * pObj;
    int i;
    // set the number of PIs/POs
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    // start the support computation manager
    p = Supp_ManStart( 1 << 20, 1 << 6 );
    // consider objects in the topological order
    vSupports = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkCleanCopy(pNtk);
    // order the nodes so that the PIs and POs follow naturally
    vNodes = Abc_NtkDfsNatural( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
        {
            pPart0 = (Supp_One_t *)Abc_ObjFanin0(pObj)->pCopy;
            pPart1 = (Supp_One_t *)Abc_ObjFanin1(pObj)->pCopy;
            pObj->pCopy = (Abc_Obj_t *)Supp_ManMergeEntry( p, pPart0, pPart1, Abc_ObjFanoutNum(pObj) );
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Supp_ManRecycleEntry( p, pPart0 );
            assert( pPart1->nRefs > 0 );
            if ( --pPart1->nRefs == 0 )
                Supp_ManRecycleEntry( p, pPart1 );
            continue;
        }
        if ( Abc_ObjIsCo(pObj) )
        {
            pPart0 = (Supp_One_t *)Abc_ObjFanin0(pObj)->pCopy;
            // only save the CO if it is non-trivial
            if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
            {
                vSupp = Supp_ManTransferEntry(pPart0);
                Vec_IntPush( vSupp, (int)(ABC_PTRINT_T)pObj->pNext );
                Vec_PtrPush( vSupports, vSupp );
            }
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Supp_ManRecycleEntry( p, pPart0 );
            continue;
        }
        if ( Abc_ObjIsCi(pObj) )
        {
            if ( Abc_ObjFanoutNum(pObj) )
            {
                pPart0 = (Supp_One_t *)Supp_ManFetchEntry( p, 1, Abc_ObjFanoutNum(pObj) );
                pPart0->pOuts[ pPart0->nOuts++ ] = (int)(ABC_PTRINT_T)pObj->pNext;
                pObj->pCopy = (Abc_Obj_t *)pPart0;
            }
            continue;
        }
        if ( pObj == Abc_AigConst1(pNtk) )
        {
            if ( Abc_ObjFanoutNum(pObj) )
                pObj->pCopy = (Abc_Obj_t *)Supp_ManFetchEntry( p, 0, Abc_ObjFanoutNum(pObj) );
            continue;
        }
        assert( 0 );
    }
    Vec_PtrFree( vNodes );
//printf( "Memory usage = %d MB.\n", Vec_PtrSize(p->vMemory) * p->nChunkSize / (1<<20) );
    Supp_ManStop( p );
    // sort supports by size
    Vec_VecSort( (Vec_Vec_t *)vSupports, 1 );
    // clear the number of PIs/POs
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = NULL;
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->pNext = NULL;
/*
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSupp, i )
        printf( "%d ", Vec_IntSize(vSupp) );
    printf( "\n" );
*/
    return vSupports;
}